

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

void GD::multipredict<false,false>
               (gd *g,base_learner *param_2,example *ec,size_t count,size_t step,
               polyprediction *pred,bool finalize_predictions)

{
  vw *all;
  undefined1 auVar1 [16];
  ulong uVar2;
  polyprediction *ppVar3;
  vw *pvVar4;
  size_t sVar5;
  float fVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  multipredict_info<sparse_parameters> local_40;
  long lVar10;
  
  auVar1 = _DAT_002755a0;
  all = g->all;
  pvVar4 = all;
  if (count != 0) {
    fVar6 = (ec->l).simple.initial;
    uVar2 = count + 3 & 0xfffffffffffffffc;
    lVar10 = count - 1;
    auVar7._8_4_ = (int)lVar10;
    auVar7._0_8_ = lVar10;
    auVar7._12_4_ = (int)((ulong)lVar10 >> 0x20);
    ppVar3 = pred + 3;
    auVar7 = auVar7 ^ _DAT_002755a0;
    auVar9 = _DAT_002755d0;
    auVar11 = _DAT_002755e0;
    do {
      auVar12 = auVar11 ^ auVar1;
      iVar8 = auVar7._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar8 && auVar7._0_4_ < auVar12._0_4_ || iVar8 < auVar12._4_4_)
                & 1)) {
        ppVar3[-3].scalar = fVar6;
      }
      if ((auVar12._12_4_ != auVar7._12_4_ || auVar12._8_4_ <= auVar7._8_4_) &&
          auVar12._12_4_ <= auVar7._12_4_) {
        ppVar3[-2].scalar = fVar6;
      }
      auVar12 = auVar9 ^ auVar1;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar8 && (iVar13 != iVar8 || auVar12._0_4_ <= auVar7._0_4_)) {
        ppVar3[-1].scalar = fVar6;
        ppVar3->scalar = fVar6;
      }
      lVar10 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar10 + 4;
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar10 + 4;
      ppVar3 = ppVar3 + 4;
      uVar2 = uVar2 - 4;
    } while (uVar2 != 0);
    pvVar4 = g->all;
  }
  local_40.count = count;
  local_40.step = step;
  local_40.pred = pred;
  if ((pvVar4->weights).sparse == true) {
    local_40.weights = &(pvVar4->weights).sparse_weights;
    local_40.gravity = (float)all->sd->gravity;
    foreach_feature<GD::multipredict_info<sparse_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,&local_40);
  }
  else {
    local_40.weights = (sparse_parameters *)&(pvVar4->weights).dense_weights;
    local_40.gravity = (float)all->sd->gravity;
    foreach_feature<GD::multipredict_info<dense_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,(multipredict_info<dense_parameters> *)&local_40);
  }
  ppVar3 = pred;
  sVar5 = count;
  if (count != 0 && all->sd->contraction != 1.0) {
    do {
      ppVar3->scalar = (float)all->sd->contraction * ppVar3->scalar;
      sVar5 = sVar5 - 1;
      ppVar3 = ppVar3 + 1;
    } while (sVar5 != 0);
  }
  if (finalize_predictions && count != 0) {
    do {
      fVar6 = finalize_prediction(all->sd,pred->scalar);
      pred->scalar = fVar6;
      pred = pred + 1;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void multipredict(
    gd& g, base_learner&, example& ec, size_t count, size_t step, polyprediction* pred, bool finalize_predictions)
{
  vw& all = *g.all;
  for (size_t c = 0; c < count; c++) pred[c].scalar = ec.l.simple.initial;
  if (g.all->weights.sparse)
  {
    multipredict_info<sparse_parameters> mp = {
        count, step, pred, g.all->weights.sparse_weights, (float)all.sd->gravity};
    if (l1)
      foreach_feature<multipredict_info<sparse_parameters>, uint64_t, vec_add_trunc_multipredict>(all, ec, mp);
    else
      foreach_feature<multipredict_info<sparse_parameters>, uint64_t, vec_add_multipredict>(all, ec, mp);
  }
  else
  {
    multipredict_info<dense_parameters> mp = {count, step, pred, g.all->weights.dense_weights, (float)all.sd->gravity};
    if (l1)
      foreach_feature<multipredict_info<dense_parameters>, uint64_t, vec_add_trunc_multipredict>(all, ec, mp);
    else
      foreach_feature<multipredict_info<dense_parameters>, uint64_t, vec_add_multipredict>(all, ec, mp);
  }
  if (all.sd->contraction != 1.)
    for (size_t c = 0; c < count; c++) pred[c].scalar *= (float)all.sd->contraction;
  if (finalize_predictions)
    for (size_t c = 0; c < count; c++) pred[c].scalar = finalize_prediction(all.sd, pred[c].scalar);
  if (audit)
  {
    for (size_t c = 0; c < count; c++)
    {
      ec.pred.scalar = pred[c].scalar;
      print_audit_features(all, ec);
      ec.ft_offset += (uint64_t)step;
    }
    ec.ft_offset -= (uint64_t)(step * count);
  }
}